

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::GetInstallObjectNames
          (cmInstallTargetGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objects)

{
  pointer pbVar1;
  pointer this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined8 local_70;
  char *local_68;
  size_type local_60;
  pointer local_58;
  string local_50;
  
  cmGeneratorTarget::GetTargetObjectNames(this->Target,config,objects);
  this_00 = (objects->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (objects->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pbVar1) {
    do {
      anon_unknown.dwarf_19a0d65::computeInstallObjectDir(&local_a0,this->Target,config);
      local_80._M_len = local_a0._M_string_length;
      local_80._M_str = local_a0._M_dataplus._M_p;
      local_70 = 1;
      local_68 = "/";
      local_58 = (this_00->_M_dataplus)._M_p;
      local_60 = this_00->_M_string_length;
      views._M_len = 3;
      views._M_array = &local_80;
      cmCatViews_abi_cxx11_(&local_50,views);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pbVar1);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::GetInstallObjectNames(
  std::string const& config, std::vector<std::string>& objects) const
{
  this->Target->GetTargetObjectNames(config, objects);
  for (std::string& o : objects) {
    o = cmStrCat(computeInstallObjectDir(this->Target, config), "/", o);
  }
}